

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  ushort uVar1;
  sqlite3 *psVar2;
  int iVar3;
  ulong uVar4;
  ushort *puVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte bVar8;
  uint uVar9;
  undefined7 in_register_00000031;
  u64 n;
  uint uVar10;
  byte *pbVar11;
  long lVar12;
  ushort *puVar13;
  ushort *puVar14;
  
  if (((int)CONCAT71(in_register_00000031,desiredEnc) == 1) || (pMem->enc == '\x01')) {
    if (desiredEnc == '\x01') {
      uVar4 = (long)pMem->n & 0xfffffffffffffffe;
      pMem->n = (int)uVar4;
      n = uVar4 * 2 + 1;
    }
    else {
      n = (long)pMem->n * 2 + 2;
    }
    puVar13 = (ushort *)pMem->z;
    iVar3 = pMem->n;
    if (pMem->db == (sqlite3 *)0x0) {
      pbVar6 = (byte *)sqlite3Malloc(n);
    }
    else {
      pbVar6 = (byte *)sqlite3DbMallocRawNN(pMem->db,n);
    }
    if (pbVar6 == (byte *)0x0) {
      return 7;
    }
    puVar5 = (ushort *)((long)iVar3 + (long)puVar13);
    if (pMem->enc == '\x01') {
      pbVar7 = pbVar6;
      if (desiredEnc == '\x02') {
        if (0 < iVar3) {
          do {
            bVar8 = (byte)*puVar13;
            uVar4 = (ulong)bVar8;
            puVar13 = (ushort *)((long)puVar13 + 1);
            if (0xbf < bVar8) {
              uVar9 = (uint)""[bVar8 - 0xc0];
              while ((puVar13 != puVar5 && (uVar1 = *puVar13, ((byte)uVar1 & 0xffffffc0) == 0x80)))
              {
                puVar13 = (ushort *)((long)puVar13 + 1);
                uVar9 = uVar9 << 6 | (byte)uVar1 & 0x3f;
              }
              uVar4 = (ulong)uVar9;
              if ((uVar9 & 0xfffff800) == 0xd800) {
                uVar4 = 0xfffd;
              }
              if (uVar9 < 0x80) {
                uVar4 = 0xfffd;
              }
              if ((uVar9 & 0xfffffffe) == 0xfffe) {
                uVar4 = 0xfffd;
              }
            }
            if ((uint)uVar4 < 0x10000) {
              *(short *)pbVar7 = (short)uVar4;
              pbVar7 = pbVar7 + 2;
            }
            else {
              uVar9 = (uint)uVar4 - 0x10000;
              *pbVar7 = (byte)(uVar9 >> 10) & 0xc0 | (byte)(uVar4 >> 10) & 0x3f;
              pbVar7[1] = (byte)(uVar9 >> 0x12) & 3 | 0xd8;
              pbVar7[2] = (byte)uVar4;
              pbVar7[3] = (byte)(uVar4 >> 8) & 3 | 0xdc;
              pbVar7 = pbVar7 + 4;
            }
          } while (puVar13 < puVar5);
        }
      }
      else if (0 < iVar3) {
        do {
          bVar8 = (byte)*puVar13;
          uVar9 = (uint)bVar8;
          puVar13 = (ushort *)((long)puVar13 + 1);
          if (0xbf < bVar8) {
            uVar10 = (uint)""[bVar8 - 0xc0];
            while ((puVar13 != puVar5 && (uVar1 = *puVar13, ((byte)uVar1 & 0xffffffc0) == 0x80))) {
              puVar13 = (ushort *)((long)puVar13 + 1);
              uVar10 = uVar10 << 6 | (byte)uVar1 & 0x3f;
            }
            uVar9 = uVar10;
            if ((uVar10 & 0xfffff800) == 0xd800) {
              uVar9 = 0xfffd;
            }
            if (uVar10 < 0x80) {
              uVar9 = 0xfffd;
            }
            if ((uVar10 & 0xfffffffe) == 0xfffe) {
              uVar9 = 0xfffd;
            }
          }
          bVar8 = (byte)(uVar9 >> 8);
          if (uVar9 < 0x10000) {
            pbVar11 = pbVar7 + 1;
            *pbVar7 = bVar8;
            lVar12 = 2;
          }
          else {
            *pbVar7 = (byte)(uVar9 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar7[1] = (byte)(uVar9 - 0x10000 >> 10) & 0xc0 | (byte)(uVar9 >> 10) & 0x3f;
            pbVar11 = pbVar7 + 3;
            pbVar7[2] = bVar8 & 3 | 0xdc;
            lVar12 = 4;
          }
          pbVar7 = pbVar7 + lVar12;
          *pbVar11 = (byte)uVar9;
        } while (puVar13 < puVar5);
      }
      pMem->n = (int)pbVar7 - (int)pbVar6;
      *pbVar7 = 0;
      pbVar7 = pbVar7 + 1;
    }
    else {
      pbVar7 = pbVar6;
      if (pMem->enc == '\x02') {
        if (0 < iVar3) {
          do {
            puVar14 = puVar13 + 1;
            uVar9 = (uint)*puVar13;
            if (puVar14 < puVar5 && (*puVar13 & 0xf800) == 0xd800) {
              puVar14 = puVar13 + 2;
              uVar9 = ((uVar9 & 0x3c0 | (byte)*puVar13 & 0x3f) << 10 | (uint)(byte)puVar13[1]) +
                      (*(byte *)((long)puVar13 + 3) & 3) * 0x100 + 0x10000;
            }
            bVar8 = (byte)uVar9;
            if (uVar9 < 0x80) {
              *pbVar7 = bVar8;
              pbVar7 = pbVar7 + 1;
            }
            else if (uVar9 < 0x800) {
              *pbVar7 = (byte)(uVar9 >> 6) | 0xc0;
              pbVar7[1] = bVar8 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 2;
            }
            else if (uVar9 < 0x10000) {
              *pbVar7 = (byte)(uVar9 >> 0xc) | 0xe0;
              pbVar7[1] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
              pbVar7[2] = bVar8 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 3;
            }
            else {
              *pbVar7 = (byte)(uVar9 >> 0x12) | 0xf0;
              pbVar7[1] = (byte)(uVar9 >> 0xc) & 0x3f | 0x80;
              pbVar7[2] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
              pbVar7[3] = bVar8 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 4;
            }
            puVar13 = puVar14;
          } while (puVar14 < puVar5);
        }
      }
      else if (0 < iVar3) {
        do {
          puVar14 = puVar13 + 1;
          uVar9 = (uint)CONCAT11((byte)*puVar13,*(byte *)((long)puVar13 + 1));
          if (puVar14 < puVar5 && ((byte)*puVar13 & 0xf8) == 0xd8) {
            puVar14 = puVar13 + 2;
            uVar9 = ((uVar9 & 0x3c0 | *(byte *)((long)puVar13 + 1) & 0x3f) << 10 |
                    (uint)*(byte *)((long)puVar13 + 3)) + ((byte)puVar13[1] & 3) * 0x100 + 0x10000;
          }
          bVar8 = (byte)uVar9;
          if (uVar9 < 0x80) {
            *pbVar7 = bVar8;
            pbVar7 = pbVar7 + 1;
          }
          else if (uVar9 < 0x800) {
            *pbVar7 = (byte)(uVar9 >> 6) | 0xc0;
            pbVar7[1] = bVar8 & 0x3f | 0x80;
            pbVar7 = pbVar7 + 2;
          }
          else if (uVar9 < 0x10000) {
            *pbVar7 = (byte)(uVar9 >> 0xc) | 0xe0;
            pbVar7[1] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
            pbVar7[2] = bVar8 & 0x3f | 0x80;
            pbVar7 = pbVar7 + 3;
          }
          else {
            *pbVar7 = (byte)(uVar9 >> 0x12) | 0xf0;
            pbVar7[1] = (byte)(uVar9 >> 0xc) & 0x3f | 0x80;
            pbVar7[2] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
            pbVar7[3] = bVar8 & 0x3f | 0x80;
            pbVar7 = pbVar7 + 4;
          }
          puVar13 = puVar14;
        } while (puVar14 < puVar5);
      }
      pMem->n = (int)pbVar7 - (int)pbVar6;
    }
    *pbVar7 = 0;
    uVar1 = pMem->flags;
    if (((uVar1 & 0x2400) != 0) || (pMem->szMalloc != 0)) {
      vdbeMemClear(pMem);
    }
    pMem->flags = uVar1 & 0x801d | 0x202;
    pMem->enc = desiredEnc;
    pMem->z = (char *)pbVar6;
    pMem->zMalloc = (char *)pbVar6;
    psVar2 = pMem->db;
    if (((psVar2 == (sqlite3 *)0x0) || (pbVar6 < (psVar2->lookaside).pStart)) ||
       ((psVar2->lookaside).pEnd <= pbVar6)) {
      uVar9 = (*sqlite3Config.m.xSize)(pbVar6);
    }
    else {
      uVar9 = (uint)(psVar2->lookaside).sz;
    }
    pMem->szMalloc = uVar9;
  }
  else {
    iVar3 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar3 != 0) {
      return 7;
    }
    uVar4 = (long)pMem->n & 0xfffffffffffffffe;
    if (0 < (int)uVar4) {
      puVar13 = (ushort *)pMem->z;
      puVar5 = (ushort *)(uVar4 + (long)puVar13);
      do {
        *puVar13 = *puVar13 << 8 | *puVar13 >> 8;
        puVar13 = puVar13 + 1;
      } while (puVar13 < puVar5);
    }
    pMem->enc = desiredEnc;
  }
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  sqlite3_int64 len;          /* Maximum length of output string in bytes */
  unsigned char *zOut;        /* Output buffer */
  unsigned char *zIn;         /* Input iterator */
  unsigned char *zTerm;       /* End of input */
  unsigned char *z;           /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "INPUT:  %s\n", zBuf);
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then 
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM_BKPT;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = 2 * (sqlite3_int64)pMem->n + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = 2 * (sqlite3_int64)pMem->n + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM_BKPT;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16LE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16BE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = pMem->flags;
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Str|MEM_Term|(c&(MEM_AffMask|MEM_Subtype));
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "OUTPUT: %s\n", zBuf);
  }
#endif
  return SQLITE_OK;
}